

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkRevoluteTranslational.cpp
# Opt level: O2

void __thiscall
chrono::ChLinkRevoluteTranslational::ChLinkRevoluteTranslational
          (ChLinkRevoluteTranslational *this,ChLinkRevoluteTranslational *other)

{
  undefined1 auVar1 [64];
  ChBodyFrame *pCVar2;
  ChBodyFrame *pCVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  int i;
  int iVar7;
  int iVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  long lVar9;
  
  ChLink::ChLink(&this->super_ChLink,&other->super_ChLink);
  (this->super_ChLink).super_ChLinkBase.super_ChPhysicsItem.super_ChObj._vptr_ChObj =
       (_func_int **)&PTR__ChLinkRevoluteTranslational_011695c0;
  auVar1 = vmovdqu64_avx512f(ZEXT1664((undefined1  [16])0x0));
  this->m_p1 = (ChVector<double>)auVar1._0_24_;
  this->m_p2 = (ChVector<double>)auVar1._24_24_;
  (this->m_z1).m_data[0] = (double)auVar1._48_8_;
  (this->m_z1).m_data[1] = (double)auVar1._56_8_;
  auVar1 = vmovdqu64_avx512f(ZEXT1664((undefined1  [16])0x0));
  *(undefined1 (*) [64])((this->m_z1).m_data + 1) = auVar1;
  ChConstraintTwoBodies::ChConstraintTwoBodies(&this->m_cnstr_par1);
  ChConstraintTwoBodies::ChConstraintTwoBodies(&this->m_cnstr_par2);
  ChConstraintTwoBodies::ChConstraintTwoBodies(&this->m_cnstr_dot);
  ChConstraintTwoBodies::ChConstraintTwoBodies(&this->m_cnstr_dist);
  pCVar2 = (other->super_ChLink).Body1;
  pCVar3 = (other->super_ChLink).Body2;
  (this->super_ChLink).Body1 = pCVar2;
  (this->super_ChLink).Body2 = pCVar3;
  (this->super_ChLink).super_ChLinkBase.super_ChPhysicsItem.system =
       (other->super_ChLink).super_ChLinkBase.super_ChPhysicsItem.system;
  if (other != this) {
    (this->m_p1).m_data[0] = (other->m_p1).m_data[0];
    (this->m_p1).m_data[1] = (other->m_p1).m_data[1];
    (this->m_p1).m_data[2] = (other->m_p1).m_data[2];
    (this->m_p2).m_data[0] = (other->m_p2).m_data[0];
    (this->m_p2).m_data[1] = (other->m_p2).m_data[1];
    (this->m_p2).m_data[2] = (other->m_p2).m_data[2];
    (this->m_z1).m_data[0] = (other->m_z1).m_data[0];
    (this->m_z1).m_data[1] = (other->m_z1).m_data[1];
    (this->m_z1).m_data[2] = (other->m_z1).m_data[2];
    (this->m_x2).m_data[0] = (other->m_x2).m_data[0];
    (this->m_x2).m_data[1] = (other->m_x2).m_data[1];
    (this->m_x2).m_data[2] = (other->m_x2).m_data[2];
    (this->m_y2).m_data[0] = (other->m_y2).m_data[0];
    (this->m_y2).m_data[1] = (other->m_y2).m_data[1];
    (this->m_y2).m_data[2] = (other->m_y2).m_data[2];
  }
  dVar4 = other->m_cur_par1;
  dVar5 = other->m_cur_par2;
  dVar6 = other->m_cur_dot;
  this->m_dist = other->m_dist;
  this->m_cur_par1 = dVar4;
  this->m_cur_par2 = dVar5;
  this->m_cur_dot = dVar6;
  this->m_cur_dist = other->m_cur_dist;
  iVar7 = (*(pCVar2->super_ChFrameMoving<double>).super_ChFrame<double>._vptr_ChFrame[0x10])();
  iVar8 = (*(((other->super_ChLink).Body2)->super_ChFrameMoving<double>).super_ChFrame<double>.
            _vptr_ChFrame[0x10])();
  ChConstraintTwoBodies::SetVariables
            (&this->m_cnstr_par1,(ChVariables *)CONCAT44(extraout_var,iVar7),
             (ChVariables *)CONCAT44(extraout_var_00,iVar8));
  iVar7 = (*(((other->super_ChLink).Body1)->super_ChFrameMoving<double>).super_ChFrame<double>.
            _vptr_ChFrame[0x10])();
  iVar8 = (*(((other->super_ChLink).Body2)->super_ChFrameMoving<double>).super_ChFrame<double>.
            _vptr_ChFrame[0x10])();
  ChConstraintTwoBodies::SetVariables
            (&this->m_cnstr_par2,(ChVariables *)CONCAT44(extraout_var_01,iVar7),
             (ChVariables *)CONCAT44(extraout_var_02,iVar8));
  iVar7 = (*(((other->super_ChLink).Body1)->super_ChFrameMoving<double>).super_ChFrame<double>.
            _vptr_ChFrame[0x10])();
  iVar8 = (*(((other->super_ChLink).Body2)->super_ChFrameMoving<double>).super_ChFrame<double>.
            _vptr_ChFrame[0x10])();
  ChConstraintTwoBodies::SetVariables
            (&this->m_cnstr_dot,(ChVariables *)CONCAT44(extraout_var_03,iVar7),
             (ChVariables *)CONCAT44(extraout_var_04,iVar8));
  iVar7 = (*(((other->super_ChLink).Body1)->super_ChFrameMoving<double>).super_ChFrame<double>.
            _vptr_ChFrame[0x10])();
  iVar8 = (*(((other->super_ChLink).Body2)->super_ChFrameMoving<double>).super_ChFrame<double>.
            _vptr_ChFrame[0x10])();
  ChConstraintTwoBodies::SetVariables
            (&this->m_cnstr_dist,(ChVariables *)CONCAT44(extraout_var_05,iVar7),
             (ChVariables *)CONCAT44(extraout_var_06,iVar8));
  for (lVar9 = 0; lVar9 != 4; lVar9 = lVar9 + 1) {
    this->m_multipliers[lVar9] = other->m_multipliers[lVar9];
  }
  return;
}

Assistant:

ChLinkRevoluteTranslational::ChLinkRevoluteTranslational(const ChLinkRevoluteTranslational& other) : ChLink(other) {
    Body1 = other.Body1;
    Body2 = other.Body2;
    system = other.system;

    m_p1 = other.m_p1;
    m_p2 = other.m_p2;
    m_z1 = other.m_z1;
    m_x2 = other.m_x2;
    m_y2 = other.m_y2;
    m_dist = other.m_dist;
    m_cur_par1 = other.m_cur_par1;
    m_cur_par2 = other.m_cur_par2;
    m_cur_dot = other.m_cur_dot;
    m_cur_dist = other.m_cur_dist;

    m_cnstr_par1.SetVariables(&other.Body1->Variables(), &other.Body2->Variables());
    m_cnstr_par2.SetVariables(&other.Body1->Variables(), &other.Body2->Variables());
    m_cnstr_dot.SetVariables(&other.Body1->Variables(), &other.Body2->Variables());
    m_cnstr_dist.SetVariables(&other.Body1->Variables(), &other.Body2->Variables());

    for (int i = 0; i < 4; i++) {
        m_multipliers[i] = other.m_multipliers[i];
    }
}